

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall QO_Manager::Compute(QO_Manager *this,QO_Rel *relOrder,float *costEst,float *tupleEst)

{
  int iVar1;
  pointer pmVar2;
  pointer piVar3;
  RC RVar4;
  uint uVar5;
  iterator iVar6;
  iterator iVar7;
  mapped_type *ppcVar8;
  uint *puVar9;
  int i;
  int iVar10;
  uint uVar11;
  int i_1;
  int iVar12;
  int j;
  uint uVar13;
  uint uVar14;
  long lVar15;
  RC local_c4;
  uint local_b4;
  long local_b0;
  vector<int,_std::allocator<int>_> allNewSubsets;
  vector<int,_std::allocator<int>_> allSubsets;
  
  RVar4 = InitializeBaseCases(this);
  if (RVar4 != 0) {
    return RVar4;
  }
  allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (iVar10 = 0; iVar10 < this->nRels; iVar10 = iVar10 + 1) {
    if (iVar10 == 0x21) goto LAB_00111bed;
    allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,1 << ((byte)iVar10 & 0x1f))
    ;
    std::vector<int,_std::allocator<int>_>::push_back
              (&allSubsets,(value_type_conflict1 *)&allNewSubsets);
  }
  lVar15 = 1;
  do {
    uVar5 = this->nRels;
    if ((int)uVar5 <= lVar15) {
      uVar14 = 0;
      uVar13 = uVar5;
      if ((int)uVar5 < 1) {
        uVar13 = 0;
      }
      uVar11 = 0;
      goto LAB_00111bdd;
    }
    allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b0 = (lVar15 + -1) * 0x30;
    for (puVar9 = (uint *)allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        piVar3 = allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        puVar9 != (uint *)allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
      for (uVar13 = 0; (int)uVar13 < (int)uVar5; uVar13 = uVar13 + 1) {
        uVar5 = *puVar9;
        uVar14 = 1 << ((byte)uVar13 & 0x1f);
        local_b4 = uVar14;
        if (0x20 < uVar13) {
          local_b4 = 0;
        }
        local_b4 = local_b4 | uVar5;
        iVar6 = std::
                _Rb_tree<int,_std::pair<const_int,_costElem_*>,_std::_Select1st<std::pair<const_int,_costElem_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_costElem_*>,_std::_Select1st<std::pair<const_int,_costElem_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                        *)((long)&(((this->optcost).
                                    super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                  field_0x0 + local_b0),(key_type *)&local_b4);
        pmVar2 = (this->optcost).
                 super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = std::
                _Rb_tree<int,_std::pair<const_int,_costElem_*>,_std::_Select1st<std::pair<const_int,_costElem_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::find(&pmVar2[lVar15]._M_t,(key_type *)&local_b4);
        if ((((uVar13 < 0x21) && ((uVar5 & uVar14) == 0)) &&
            (iVar6._M_node ==
             (_Base_ptr)((long)&(pmVar2->_M_t)._M_impl.super__Rb_tree_header + local_b0))) &&
           (iVar7._M_node ==
            &(this->optcost).
             super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t._M_impl.super__Rb_tree_header.
             _M_header)) {
          RVar4 = CalculateOptJoin(this,local_b4,(int)lVar15);
          if (RVar4 != 0) goto LAB_00111b97;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&allNewSubsets,(value_type_conflict1 *)&local_b4);
        }
        uVar5 = this->nRels;
      }
    }
    if (puVar9 != (uint *)allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::vector<int,_std::allocator<int>_>::operator=(&allSubsets,&allNewSubsets);
    RVar4 = local_c4;
LAB_00111b97:
    local_c4 = RVar4;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&allNewSubsets.super__Vector_base<int,_std::allocator<int>_>);
    lVar15 = lVar15 + 1;
  } while (puVar9 == (uint *)piVar3);
LAB_00111bf5:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&allSubsets.super__Vector_base<int,_std::allocator<int>_>);
  return local_c4;
LAB_00111bdd:
  if (uVar13 == uVar11) goto LAB_00111c15;
  if (uVar11 == 0x21) goto LAB_00111bed;
  uVar14 = uVar14 | 1 << (uVar11 & 0x1f);
  uVar11 = uVar11 + 1;
  goto LAB_00111bdd;
LAB_00111c15:
  allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,uVar14);
  ppcVar8 = std::
            map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
            ::operator[]((this->optcost).
                         super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar5 + -1,
                         (key_type *)&allNewSubsets);
  *costEst = (*ppcVar8)->cost;
  ppcVar8 = std::
            map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
            ::operator[]((this->optcost).
                         super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)this->nRels + -1,
                         (key_type *)&allNewSubsets);
  *tupleEst = (*ppcVar8)->numTuples;
  local_c4 = 0;
  iVar10 = -1;
  for (iVar12 = 0; iVar12 < this->nRels; iVar12 = iVar12 + 1) {
    local_b0 = CONCAT44(local_b0._4_4_,iVar10);
    iVar10 = this->nRels + iVar10;
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar10,
                           (key_type *)&allNewSubsets);
    iVar1 = (*ppcVar8)->joins;
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar10,
                           (key_type *)&allNewSubsets);
    relOrder[iVar10].relIdx = (*ppcVar8)->newRelIndex;
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar10,
                           (key_type *)&allNewSubsets);
    relOrder[iVar10].indexAttr = (*ppcVar8)->indexAttr;
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar10,
                           (key_type *)&allNewSubsets);
    relOrder[iVar10].indexCond = (*ppcVar8)->indexCond;
    allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,iVar1);
    iVar10 = (int)local_b0 + -1;
  }
  goto LAB_00111bf5;
LAB_00111bed:
  local_c4 = 0x19b;
  goto LAB_00111bf5;
}

Assistant:

RC QO_Manager::Compute(QO_Rel *relOrder, float &costEst, float &tupleEst){
  RC rc = 0;
  // initialize the base relations
  if((rc = InitializeBaseCases()))
    return (rc);

  // create a vector containing bitmaps that
  // reflect all subsets of size 1
  vector<int> allSubsets;
  for(int i=0; i < nRels; i++){
    int bitmap = 0;
    if((rc = AddRelToBitmap(i, bitmap)))
      return (rc);
    allSubsets.push_back(bitmap);
  }

  for(int i=1; i < nRels; i++){ // for all sizes of subsets
    vector<int> allNewSubsets; // will hold all subsets of size i+1
                               // at the end of the iteration
    // iterate through all sets of the previous size
    vector<int>::iterator it;
    for(it= allSubsets.begin(); it != allSubsets.end(); ++it){
      for(int j=0; j < nRels; j++){ // go through all ways of adding a new relation
        int relsInJoin = *it;
        int newRelsInJoin = relsInJoin;
        AddRelToBitmap(j, newRelsInJoin);
        bool isInOptCost1 = (optcost[i-1].find(newRelsInJoin) != optcost[i-1].end());
        bool isInOptCost2 = (optcost[i].find(newRelsInJoin) != optcost[i].end());
        // If adding this new relation modifies the set (i.e. relation is not)
        // included in the set of the previous size) and we haven't calculated
        // the optimal way of joining this yet, do so
        if(!IsBitSet(j, relsInJoin) && !isInOptCost1 && !isInOptCost2){
          if((rc = CalculateOptJoin(newRelsInJoin, i))){
            return (rc);
          }
          // add this to the set.
          allNewSubsets.push_back(newRelsInJoin);
        }
      }
    }
    allSubsets.clear();
    allSubsets = allNewSubsets;
    // set the previous set of joins of size i to the set of joins
    // of size i+1
  }

  // create the bitmap containing all relations
  int relsInJoin = 0;
  for(int i = 0; i < nRels; i++){
    if((rc = AddRelToBitmap(i, relsInJoin)))
      return (rc);
  }
  // update the overall estimated costs and tuple numbers
  costEst = optcost[nRels-1][relsInJoin]->cost;
  tupleEst = optcost[nRels-1][relsInJoin]->numTuples;
  // backtrace: start with the set of all relations, and use the
  // "joins" field to get the cost stats of the previous opt join, and
  // move them to the appropriate location in QO_Rel array
  for(int i=0; i < nRels; i++){
    int index = nRels-i-1;
    int nextSubJoin = optcost[index][relsInJoin]->joins;
    relOrder[index].relIdx = optcost[index][relsInJoin]->newRelIndex;
    relOrder[index].indexAttr = optcost[index][relsInJoin]->indexAttr;
    relOrder[index].indexCond = optcost[index][relsInJoin]->indexCond;
    relsInJoin = nextSubJoin;
  }

  return (0);
}